

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

void bitset_inplace_intersection(bitset_t *b1,bitset_t *b2)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar1 = b1->arraysize;
  uVar3 = b2->arraysize;
  if (uVar1 < b2->arraysize) {
    uVar3 = uVar1;
  }
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    b1->array[uVar4] = b1->array[uVar4] & b2->array[uVar4];
  }
  lVar2 = uVar1 + uVar3 * -2 + uVar4;
  while (bVar5 = lVar2 != 0, lVar2 = lVar2 + -1, bVar5) {
    b1->array[uVar3] = 0;
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void bitset_inplace_intersection(bitset_t *CBITSET_RESTRICT b1,
                                 const bitset_t *CBITSET_RESTRICT b2) {
    size_t minlength =
        b1->arraysize < b2->arraysize ? b1->arraysize : b2->arraysize;
    size_t k = 0;
    for (; k < minlength; ++k) {
        b1->array[k] &= b2->array[k];
    }
    for (; k < b1->arraysize; ++k) {
        b1->array[k] = 0;  // memset could, maybe, be a tiny bit faster
    }
}